

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

void adios2sys::RegExpCompile::regtail(char *p,char *val)

{
  char *pcVar1;
  short in_SI;
  char *in_RDI;
  int offset;
  char *temp;
  char *scan;
  short local_24;
  char *local_18;
  
  pcVar1 = in_RDI;
  if (in_RDI != &regdummy) {
    do {
      local_18 = pcVar1;
      pcVar1 = regnext(local_18);
    } while (pcVar1 != (char *)0x0);
    if (*local_18 == '\a') {
      local_24 = (short)local_18 - in_SI;
    }
    else {
      local_24 = in_SI - (short)local_18;
    }
    local_18[1] = (char)((ushort)local_24 >> 8);
    local_18[2] = (char)local_24;
  }
  return;
}

Assistant:

void RegExpCompile::regtail(char* p, const char* val)
{
  char* scan;
  char* temp;
  int offset;

  if (p == regdummyptr)
    return;

  // Find last node.
  scan = p;
  for (;;) {
    temp = regnext(scan);
    if (!temp)
      break;
    scan = temp;
  }

  if (OP(scan) == BACK)
    offset = int(scan - val);
  else
    offset = int(val - scan);
  *(scan + 1) = static_cast<char>((offset >> 8) & 0377);
  *(scan + 2) = static_cast<char>(offset & 0377);
}